

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O2

void __thiscall
diy::Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<float>_>_>::~Registrar
          (Registrar<diy::RegularLink<diy::Bounds<float>_>_> *this)

{
  Link::~Link(&this->super_Link);
  operator_delete(this,0x20);
  return;
}

Assistant:

static bool registerT()
            {
                const auto name = typeid(T).name();
                Factory::data()[name] = [](Args... args) -> Base*
                {
                    return new T(std::forward<Args>(args)...);
                };
                return true;
            }